

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::ExpandVariablesCMP0019(cmMakefile *this)

{
  cmTarget *pcVar1;
  bool bVar2;
  byte bVar3;
  PolicyStatus PVar4;
  TargetType TVar5;
  char *pcVar6;
  pointer ppVar7;
  string *psVar8;
  reference pbVar9;
  ostream *poVar10;
  cmake *this_00;
  PolicyID id;
  string local_5e8;
  string local_5c8 [32];
  string local_5a8;
  undefined1 local_588 [8];
  ostringstream m;
  string local_410 [32];
  undefined1 local_3f0 [8];
  string orig_1;
  string libName;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3a8;
  iterator l_1;
  string local_398;
  undefined1 local_378 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkLibs;
  string local_358;
  char *local_338;
  char *linkLibsProp;
  undefined1 local_328 [8];
  string orig;
  undefined1 local_300 [8];
  string d;
  string local_2d8;
  char *local_2b8;
  char *linkDirsProp;
  string local_2a8;
  allocator local_281;
  undefined1 local_280 [8];
  string dirs_1;
  string local_258;
  cmTarget *local_238;
  cmTarget *t;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_228;
  iterator l;
  string local_218;
  allocator local_1f1;
  undefined1 local_1f0 [8];
  string dirs;
  allocator local_1b9;
  string local_1b8;
  char *local_198;
  char *includeDirs;
  ostringstream w;
  PolicyStatus pol;
  cmMakefile *this_local;
  
  PVar4 = GetPolicyStatus(this,CMP0019);
  if ((PVar4 == OLD) || (PVar4 == WARN)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&includeDirs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b8,"INCLUDE_DIRECTORIES",&local_1b9);
    pcVar6 = GetProperty(this,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    local_198 = pcVar6;
    bVar2 = mightExpandVariablesCMP0019(pcVar6);
    pcVar6 = local_198;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_1f0,pcVar6,&local_1f1);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
      ExpandVariablesInString(this,(string *)local_1f0,true,true,false,(char *)0x0,-1,false,false);
      if ((PVar4 == WARN) &&
         (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1f0,local_198), bVar2)) {
        poVar10 = std::operator<<((ostream *)&includeDirs,
                                  "Evaluated directory INCLUDE_DIRECTORIES\n");
        poVar10 = std::operator<<(poVar10,"  ");
        poVar10 = std::operator<<(poVar10,local_198);
        poVar10 = std::operator<<(poVar10,"\n");
        poVar10 = std::operator<<(poVar10,"as\n");
        poVar10 = std::operator<<(poVar10,"  ");
        poVar10 = std::operator<<(poVar10,(string *)local_1f0);
        std::operator<<(poVar10,"\n");
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_218,"INCLUDE_DIRECTORIES",
                 (allocator *)
                 ((long)&l.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                         ._M_cur + 7));
      pcVar6 = (char *)std::__cxx11::string::c_str();
      SetProperty(this,&local_218,pcVar6);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&l.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                         ._M_cur + 7));
      std::__cxx11::string::~string((string *)local_1f0);
    }
    local_228._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
         ::begin(&this->Targets);
    while( true ) {
      t = (cmTarget *)
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
          ::end(&this->Targets);
      bVar2 = std::__detail::operator!=
                        (&local_228,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                          *)&t);
      if (!bVar2) break;
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                             *)&local_228);
      local_238 = &ppVar7->second;
      TVar5 = cmTarget::GetType(local_238);
      if ((TVar5 != INTERFACE_LIBRARY) &&
         (TVar5 = cmTarget::GetType(local_238), pcVar1 = local_238, TVar5 != GLOBAL_TARGET)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_258,"INCLUDE_DIRECTORIES",
                   (allocator *)(dirs_1.field_2._M_local_buf + 0xf));
        local_198 = cmTarget::GetProperty(pcVar1,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator((allocator<char> *)(dirs_1.field_2._M_local_buf + 0xf));
        bVar2 = mightExpandVariablesCMP0019(local_198);
        pcVar6 = local_198;
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_280,pcVar6,&local_281);
          std::allocator<char>::~allocator((allocator<char> *)&local_281);
          ExpandVariablesInString
                    (this,(string *)local_280,true,true,false,(char *)0x0,-1,false,false);
          if ((PVar4 == WARN) &&
             (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_280,local_198), bVar2)) {
            poVar10 = std::operator<<((ostream *)&includeDirs,"Evaluated target ");
            psVar8 = cmTarget::GetName_abi_cxx11_(local_238);
            poVar10 = std::operator<<(poVar10,(string *)psVar8);
            poVar10 = std::operator<<(poVar10," INCLUDE_DIRECTORIES\n");
            poVar10 = std::operator<<(poVar10,"  ");
            poVar10 = std::operator<<(poVar10,local_198);
            poVar10 = std::operator<<(poVar10,"\n");
            poVar10 = std::operator<<(poVar10,"as\n");
            poVar10 = std::operator<<(poVar10,"  ");
            poVar10 = std::operator<<(poVar10,(string *)local_280);
            std::operator<<(poVar10,"\n");
          }
          pcVar1 = local_238;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_2a8,"INCLUDE_DIRECTORIES",
                     (allocator *)((long)&linkDirsProp + 7));
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmTarget::SetProperty(pcVar1,&local_2a8,pcVar6);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&linkDirsProp + 7));
          std::__cxx11::string::~string((string *)local_280);
        }
      }
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                    *)&local_228);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2d8,"LINK_DIRECTORIES",(allocator *)(d.field_2._M_local_buf + 0xf));
    pcVar6 = GetProperty(this,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator((allocator<char> *)(d.field_2._M_local_buf + 0xf));
    local_2b8 = pcVar6;
    if ((pcVar6 != (char *)0x0) &&
       (bVar2 = mightExpandVariablesCMP0019(pcVar6), pcVar6 = local_2b8, bVar2)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_300,pcVar6,(allocator *)(orig.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(orig.field_2._M_local_buf + 0xf));
      pcVar6 = local_2b8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_328,pcVar6,(allocator *)((long)&linkLibsProp + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&linkLibsProp + 7));
      ExpandVariablesInString(this,(string *)local_300,true,true,false,(char *)0x0,-1,false,false);
      if ((PVar4 == WARN) &&
         (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_300,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_328), bVar2)) {
        poVar10 = std::operator<<((ostream *)&includeDirs,"Evaluated link directories\n");
        poVar10 = std::operator<<(poVar10,"  ");
        poVar10 = std::operator<<(poVar10,(string *)local_328);
        poVar10 = std::operator<<(poVar10,"\n");
        poVar10 = std::operator<<(poVar10,"as\n");
        poVar10 = std::operator<<(poVar10,"  ");
        poVar10 = std::operator<<(poVar10,(string *)local_300);
        std::operator<<(poVar10,"\n");
      }
      std::__cxx11::string::~string((string *)local_328);
      std::__cxx11::string::~string((string *)local_300);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_358,"LINK_LIBRARIES",
               (allocator *)
               ((long)&linkLibs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar6 = GetProperty(this,&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&linkLibs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_338 = pcVar6;
    if (pcVar6 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_378);
      pcVar6 = local_338;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_398,pcVar6,(allocator *)((long)&l_1._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_398,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_378,false);
      std::__cxx11::string::~string((string *)&local_398);
      std::allocator<char>::~allocator((allocator<char> *)((long)&l_1._M_current + 7));
      local_3a8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_378);
      while( true ) {
        libName.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_378);
        bVar2 = __gnu_cxx::operator!=
                          (&local_3a8,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&libName.field_2 + 8));
        if (!bVar2) break;
        pbVar9 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_3a8);
        std::__cxx11::string::string((string *)(orig_1.field_2._M_local_buf + 8),(string *)pbVar9);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&orig_1.field_2 + 8),"optimized");
        if (bVar2) {
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_3a8);
          pbVar9 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_3a8);
          std::__cxx11::string::operator=
                    ((string *)(orig_1.field_2._M_local_buf + 8),(string *)pbVar9);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&orig_1.field_2 + 8),"debug");
          if (bVar2) {
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_3a8);
            pbVar9 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_3a8);
            std::__cxx11::string::operator=
                      ((string *)(orig_1.field_2._M_local_buf + 8),(string *)pbVar9);
          }
        }
        pcVar6 = (char *)std::__cxx11::string::c_str();
        bVar2 = mightExpandVariablesCMP0019(pcVar6);
        if (bVar2) {
          std::__cxx11::string::string
                    ((string *)local_3f0,(string *)(orig_1.field_2._M_local_buf + 8));
          ExpandVariablesInString
                    (this,(string *)((long)&orig_1.field_2 + 8),true,true,false,(char *)0x0,-1,false
                     ,false);
          if ((PVar4 == WARN) &&
             (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&orig_1.field_2 + 8),
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_3f0), bVar2)) {
            poVar10 = std::operator<<((ostream *)&includeDirs,"Evaluated link library\n");
            poVar10 = std::operator<<(poVar10,"  ");
            poVar10 = std::operator<<(poVar10,(string *)local_3f0);
            poVar10 = std::operator<<(poVar10,"\n");
            poVar10 = std::operator<<(poVar10,"as\n");
            poVar10 = std::operator<<(poVar10,"  ");
            poVar10 = std::operator<<(poVar10,(string *)(orig_1.field_2._M_local_buf + 8));
            std::operator<<(poVar10,"\n");
          }
          std::__cxx11::string::~string((string *)local_3f0);
        }
        std::__cxx11::string::~string((string *)(orig_1.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_3a8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_378);
    }
    std::__cxx11::ostringstream::str();
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_410);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_588);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_5a8,(cmPolicies *)0x13,id);
      poVar10 = std::operator<<((ostream *)local_588,(string *)&local_5a8);
      poVar10 = std::operator<<(poVar10,"\n");
      poVar10 = std::operator<<(poVar10,"The following variable evaluations were encountered:\n");
      std::__cxx11::ostringstream::str();
      std::operator<<(poVar10,local_5c8);
      std::__cxx11::string::~string(local_5c8);
      std::__cxx11::string::~string((string *)&local_5a8);
      this_00 = GetCMakeInstance(this);
      std::__cxx11::ostringstream::str();
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_5e8,&this->Backtrace);
      std::__cxx11::string::~string((string *)&local_5e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_588);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&includeDirs);
  }
  return;
}

Assistant:

void cmMakefile::ExpandVariablesCMP0019()
{
  // Drop this ancient compatibility behavior with a policy.
  cmPolicies::PolicyStatus pol = this->GetPolicyStatus(cmPolicies::CMP0019);
  if (pol != cmPolicies::OLD && pol != cmPolicies::WARN) {
    return;
  }
  std::ostringstream w;

  const char* includeDirs = this->GetProperty("INCLUDE_DIRECTORIES");
  if (mightExpandVariablesCMP0019(includeDirs)) {
    std::string dirs = includeDirs;
    this->ExpandVariablesInString(dirs, true, true);
    if (pol == cmPolicies::WARN && dirs != includeDirs) {
      /* clang-format off */
      w << "Evaluated directory INCLUDE_DIRECTORIES\n"
        << "  " << includeDirs << "\n"
        << "as\n"
        << "  " << dirs << "\n";
      /* clang-format on */
    }
    this->SetProperty("INCLUDE_DIRECTORIES", dirs.c_str());
  }

  // Also for each target's INCLUDE_DIRECTORIES property:
  for (cmTargets::iterator l = this->Targets.begin(); l != this->Targets.end();
       ++l) {
    cmTarget& t = l->second;
    if (t.GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        t.GetType() == cmStateEnums::GLOBAL_TARGET) {
      continue;
    }
    includeDirs = t.GetProperty("INCLUDE_DIRECTORIES");
    if (mightExpandVariablesCMP0019(includeDirs)) {
      std::string dirs = includeDirs;
      this->ExpandVariablesInString(dirs, true, true);
      if (pol == cmPolicies::WARN && dirs != includeDirs) {
        /* clang-format off */
        w << "Evaluated target " << t.GetName() << " INCLUDE_DIRECTORIES\n"
          << "  " << includeDirs << "\n"
          << "as\n"
          << "  " << dirs << "\n";
        /* clang-format on */
      }
      t.SetProperty("INCLUDE_DIRECTORIES", dirs.c_str());
    }
  }

  if (const char* linkDirsProp = this->GetProperty("LINK_DIRECTORIES")) {
    if (mightExpandVariablesCMP0019(linkDirsProp)) {
      std::string d = linkDirsProp;
      std::string orig = linkDirsProp;
      this->ExpandVariablesInString(d, true, true);
      if (pol == cmPolicies::WARN && d != orig) {
        /* clang-format off */
        w << "Evaluated link directories\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << d << "\n";
        /* clang-format on */
      }
    }
  }

  if (const char* linkLibsProp = this->GetProperty("LINK_LIBRARIES")) {
    std::vector<std::string> linkLibs;
    cmSystemTools::ExpandListArgument(linkLibsProp, linkLibs);

    for (std::vector<std::string>::iterator l = linkLibs.begin();
         l != linkLibs.end(); ++l) {
      std::string libName = *l;
      if (libName == "optimized") {
        ++l;
        libName = *l;
      } else if (libName == "debug") {
        ++l;
        libName = *l;
      }
      if (mightExpandVariablesCMP0019(libName.c_str())) {
        std::string orig = libName;
        this->ExpandVariablesInString(libName, true, true);
        if (pol == cmPolicies::WARN && libName != orig) {
          /* clang-format off */
        w << "Evaluated link library\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << libName << "\n";
          /* clang-format on */
        }
      }
    }
  }

  if (!w.str().empty()) {
    std::ostringstream m;
    /* clang-format off */
    m << cmPolicies::GetPolicyWarning(cmPolicies::CMP0019)
      << "\n"
      << "The following variable evaluations were encountered:\n"
      << w.str();
    /* clang-format on */
    this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING, m.str(),
                                           this->Backtrace);
  }
}